

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O1

Vec_Str_t * Scl_LibertyReadGenlibStr(Scl_Tree_t *p,int fVerbose)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  Vec_Str_t *pVVar5;
  char *pcVar6;
  Scl_Item_t *pSVar7;
  Scl_Item_t *pPin;
  Scl_Item_t *pPin_00;
  size_t sVar8;
  char *pcVar9;
  int i;
  long lVar10;
  ulong uVar11;
  int i_5;
  int i_6;
  size_t sVar12;
  
  pVVar5 = (Vec_Str_t *)malloc(0x10);
  pVVar5->nCap = 1000;
  pVVar5->nSize = 0;
  pcVar6 = (char *)malloc(1000);
  pVVar5->pArray = pcVar6;
  lVar10 = 0;
  do {
    cVar1 = "GATE          _const0_  0.000000  z=CONST0;\n"[lVar10];
    uVar2 = pVVar5->nCap;
    if (pVVar5->nSize == uVar2) {
      if ((int)uVar2 < 0x10) {
        if (pVVar5->pArray == (char *)0x0) {
          pcVar6 = (char *)malloc(0x10);
        }
        else {
          pcVar6 = (char *)realloc(pVVar5->pArray,0x10);
        }
        sVar12 = 0x10;
      }
      else {
        sVar12 = (ulong)uVar2 * 2;
        if ((int)sVar12 <= (int)uVar2) goto LAB_003cf798;
        if (pVVar5->pArray == (char *)0x0) {
          pcVar6 = (char *)malloc(sVar12);
        }
        else {
          pcVar6 = (char *)realloc(pVVar5->pArray,sVar12);
        }
      }
      pVVar5->pArray = pcVar6;
      pVVar5->nCap = (int)sVar12;
    }
LAB_003cf798:
    iVar4 = pVVar5->nSize;
    pVVar5->nSize = iVar4 + 1;
    pVVar5->pArray[iVar4] = cVar1;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 0x2c);
  lVar10 = 0;
  do {
    cVar1 = "GATE          _const1_  0.000000  z=CONST1;\n"[lVar10];
    uVar2 = pVVar5->nCap;
    if (pVVar5->nSize == uVar2) {
      if ((int)uVar2 < 0x10) {
        if (pVVar5->pArray == (char *)0x0) {
          pcVar6 = (char *)malloc(0x10);
        }
        else {
          pcVar6 = (char *)realloc(pVVar5->pArray,0x10);
        }
        sVar12 = 0x10;
      }
      else {
        sVar12 = (ulong)uVar2 * 2;
        if ((int)sVar12 <= (int)uVar2) goto LAB_003cf826;
        if (pVVar5->pArray == (char *)0x0) {
          pcVar6 = (char *)malloc(sVar12);
        }
        else {
          pcVar6 = (char *)realloc(pVVar5->pArray,sVar12);
        }
      }
      pVVar5->pArray = pcVar6;
      pVVar5->nCap = (int)sVar12;
    }
LAB_003cf826:
    iVar4 = pVVar5->nSize;
    pVVar5->nSize = iVar4 + 1;
    pVVar5->pArray[iVar4] = cVar1;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 0x2c);
  pSVar7 = p->pItems;
  uVar2 = pSVar7->Child;
  if (p->nItems <= (int)uVar2) {
LAB_003d028e:
    __assert_fail("v < p->nItems",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/scl/sclLiberty.c"
                  ,0x4c,"Scl_Item_t *Scl_LibertyItem(Scl_Tree_t *, int)");
  }
  if (pSVar7 != (Scl_Item_t *)0x0 && -1 < (int)uVar2) {
    pSVar7 = pSVar7 + uVar2;
    do {
      iVar4 = (pSVar7->Key).Beg;
      iVar3 = (pSVar7->Key).End - iVar4;
      iVar4 = strncmp(p->pContents + iVar4,"cell",(long)iVar3);
      if (iVar3 == 4 && iVar4 == 0) {
        iVar4 = Scl_LibertyReadCellIsFlop(p,pSVar7);
        if (iVar4 == 0) {
          iVar4 = Scl_LibertyReadCellIsThreeState(p,pSVar7);
          if (iVar4 == 0) {
            iVar4 = Scl_LibertyReadCellOutputNum(p,pSVar7);
            if (iVar4 != 0) {
              uVar2 = pSVar7->Child;
              if ((int)uVar2 < p->nItems) {
                if (-1 < (int)uVar2) goto LAB_003cfab7;
LAB_003cfa2d:
                pPin = (Scl_Item_t *)0x0;
                do {
                  if (pPin == (Scl_Item_t *)0x0) goto LAB_003cf9d8;
                  iVar4 = (pPin->Key).Beg;
                  iVar3 = (pPin->Key).End - iVar4;
                  iVar4 = strncmp(p->pContents + iVar4,"pin",(long)iVar3);
                  if ((iVar3 == 3 && iVar4 == 0) &&
                     (pcVar6 = Scl_LibertyReadPinFormula(p,pPin), pcVar6 == (char *)0x0)) {
                    iVar4 = strcmp((char *)0x0,"0");
                    if ((iVar4 == 0) || (iVar4 = strcmp((char *)0x0,"1"), iVar4 == 0)) {
                      if (fVerbose != 0) {
                        pcVar6 = Scl_LibertyReadString(p,pSVar7->Head);
                        printf("Scl_LibertyReadGenlib() skipped cell \"%s\" with constant formula \"%s\".\n"
                               ,pcVar6,0);
                      }
                      goto LAB_003cf9d8;
                    }
                    lVar10 = 0;
                    do {
                      cVar1 = "GATE "[lVar10];
                      uVar2 = pVVar5->nCap;
                      if (pVVar5->nSize == uVar2) {
                        if ((int)uVar2 < 0x10) {
                          if (pVVar5->pArray == (char *)0x0) {
                            pcVar6 = (char *)malloc(0x10);
                          }
                          else {
                            pcVar6 = (char *)realloc(pVVar5->pArray,0x10);
                          }
                          sVar12 = 0x10;
                        }
                        else {
                          sVar12 = (ulong)uVar2 * 2;
                          if ((int)sVar12 <= (int)uVar2) goto LAB_003cfb58;
                          if (pVVar5->pArray == (char *)0x0) {
                            pcVar6 = (char *)malloc(sVar12);
                          }
                          else {
                            pcVar6 = (char *)realloc(pVVar5->pArray,sVar12);
                          }
                        }
                        pVVar5->pArray = pcVar6;
                        pVVar5->nCap = (int)sVar12;
                      }
LAB_003cfb58:
                      iVar4 = pVVar5->nSize;
                      pVVar5->nSize = iVar4 + 1;
                      pVVar5->pArray[iVar4] = cVar1;
                      lVar10 = lVar10 + 1;
                    } while (lVar10 != 5);
                    pcVar6 = Scl_LibertyReadString(p,pSVar7->Head);
                    sVar12 = strlen(pcVar6);
                    if (0 < (int)(uint)sVar12) {
                      uVar11 = 0;
                      do {
                        cVar1 = pcVar6[uVar11];
                        uVar2 = pVVar5->nCap;
                        if (pVVar5->nSize == uVar2) {
                          if ((int)uVar2 < 0x10) {
                            if (pVVar5->pArray == (char *)0x0) {
                              pcVar9 = (char *)malloc(0x10);
                            }
                            else {
                              pcVar9 = (char *)realloc(pVVar5->pArray,0x10);
                            }
                            sVar8 = 0x10;
                          }
                          else {
                            sVar8 = (ulong)uVar2 * 2;
                            if ((int)sVar8 <= (int)uVar2) goto LAB_003cfc07;
                            if (pVVar5->pArray == (char *)0x0) {
                              pcVar9 = (char *)malloc(sVar8);
                            }
                            else {
                              pcVar9 = (char *)realloc(pVVar5->pArray,sVar8);
                            }
                          }
                          pVVar5->pArray = pcVar9;
                          pVVar5->nCap = (int)sVar8;
                        }
LAB_003cfc07:
                        iVar4 = pVVar5->nSize;
                        pVVar5->nSize = iVar4 + 1;
                        pVVar5->pArray[iVar4] = cVar1;
                        uVar11 = uVar11 + 1;
                      } while (((uint)sVar12 & 0x7fffffff) != uVar11);
                    }
                    uVar2 = pVVar5->nCap;
                    if (pVVar5->nSize == uVar2) {
                      if ((int)uVar2 < 0x10) {
                        if (pVVar5->pArray == (char *)0x0) {
                          pcVar6 = (char *)malloc(0x10);
                        }
                        else {
                          pcVar6 = (char *)realloc(pVVar5->pArray,0x10);
                        }
                        sVar12 = 0x10;
                      }
                      else {
                        sVar12 = (ulong)uVar2 * 2;
                        if ((int)sVar12 <= (int)uVar2) goto LAB_003cfc8f;
                        if (pVVar5->pArray == (char *)0x0) {
                          pcVar6 = (char *)malloc(sVar12);
                        }
                        else {
                          pcVar6 = (char *)realloc(pVVar5->pArray,sVar12);
                        }
                      }
                      pVVar5->pArray = pcVar6;
                      pVVar5->nCap = (int)sVar12;
                    }
LAB_003cfc8f:
                    iVar4 = pVVar5->nSize;
                    pVVar5->nSize = iVar4 + 1;
                    pVVar5->pArray[iVar4] = ' ';
                    pcVar6 = Scl_LibertyReadCellArea(p,pSVar7);
                    sVar12 = strlen(pcVar6);
                    if (0 < (int)(uint)sVar12) {
                      uVar11 = 0;
                      do {
                        cVar1 = pcVar6[uVar11];
                        uVar2 = pVVar5->nCap;
                        if (pVVar5->nSize == uVar2) {
                          if ((int)uVar2 < 0x10) {
                            if (pVVar5->pArray == (char *)0x0) {
                              pcVar9 = (char *)malloc(0x10);
                            }
                            else {
                              pcVar9 = (char *)realloc(pVVar5->pArray,0x10);
                            }
                            sVar8 = 0x10;
                          }
                          else {
                            sVar8 = (ulong)uVar2 * 2;
                            if ((int)sVar8 <= (int)uVar2) goto LAB_003cfd25;
                            if (pVVar5->pArray == (char *)0x0) {
                              pcVar9 = (char *)malloc(sVar8);
                            }
                            else {
                              pcVar9 = (char *)realloc(pVVar5->pArray,sVar8);
                            }
                          }
                          pVVar5->pArray = pcVar9;
                          pVVar5->nCap = (int)sVar8;
                        }
LAB_003cfd25:
                        iVar4 = pVVar5->nSize;
                        pVVar5->nSize = iVar4 + 1;
                        pVVar5->pArray[iVar4] = cVar1;
                        uVar11 = uVar11 + 1;
                      } while (((uint)sVar12 & 0x7fffffff) != uVar11);
                    }
                    uVar2 = pVVar5->nCap;
                    if (pVVar5->nSize == uVar2) {
                      if ((int)uVar2 < 0x10) {
                        if (pVVar5->pArray == (char *)0x0) {
                          pcVar6 = (char *)malloc(0x10);
                        }
                        else {
                          pcVar6 = (char *)realloc(pVVar5->pArray,0x10);
                        }
                        sVar12 = 0x10;
                      }
                      else {
                        sVar12 = (ulong)uVar2 * 2;
                        if ((int)sVar12 <= (int)uVar2) goto LAB_003cfdad;
                        if (pVVar5->pArray == (char *)0x0) {
                          pcVar6 = (char *)malloc(sVar12);
                        }
                        else {
                          pcVar6 = (char *)realloc(pVVar5->pArray,sVar12);
                        }
                      }
                      pVVar5->pArray = pcVar6;
                      pVVar5->nCap = (int)sVar12;
                    }
LAB_003cfdad:
                    iVar4 = pVVar5->nSize;
                    pVVar5->nSize = iVar4 + 1;
                    pVVar5->pArray[iVar4] = ' ';
                    pcVar6 = Scl_LibertyReadString(p,pPin->Head);
                    sVar12 = strlen(pcVar6);
                    if (0 < (int)(uint)sVar12) {
                      uVar11 = 0;
                      do {
                        cVar1 = pcVar6[uVar11];
                        uVar2 = pVVar5->nCap;
                        if (pVVar5->nSize == uVar2) {
                          if ((int)uVar2 < 0x10) {
                            if (pVVar5->pArray == (char *)0x0) {
                              pcVar9 = (char *)malloc(0x10);
                            }
                            else {
                              pcVar9 = (char *)realloc(pVVar5->pArray,0x10);
                            }
                            sVar8 = 0x10;
                          }
                          else {
                            sVar8 = (ulong)uVar2 * 2;
                            if ((int)sVar8 <= (int)uVar2) goto LAB_003cfe47;
                            if (pVVar5->pArray == (char *)0x0) {
                              pcVar9 = (char *)malloc(sVar8);
                            }
                            else {
                              pcVar9 = (char *)realloc(pVVar5->pArray,sVar8);
                            }
                          }
                          pVVar5->pArray = pcVar9;
                          pVVar5->nCap = (int)sVar8;
                        }
LAB_003cfe47:
                        iVar4 = pVVar5->nSize;
                        pVVar5->nSize = iVar4 + 1;
                        pVVar5->pArray[iVar4] = cVar1;
                        uVar11 = uVar11 + 1;
                      } while (((uint)sVar12 & 0x7fffffff) != uVar11);
                    }
                    uVar2 = pVVar5->nCap;
                    if (pVVar5->nSize == uVar2) {
                      if ((int)uVar2 < 0x10) {
                        if (pVVar5->pArray == (char *)0x0) {
                          pcVar6 = (char *)malloc(0x10);
                        }
                        else {
                          pcVar6 = (char *)realloc(pVVar5->pArray,0x10);
                        }
                        sVar12 = 0x10;
                      }
                      else {
                        sVar12 = (ulong)uVar2 * 2;
                        if ((int)sVar12 <= (int)uVar2) goto LAB_003cfecf;
                        if (pVVar5->pArray == (char *)0x0) {
                          pcVar6 = (char *)malloc(sVar12);
                        }
                        else {
                          pcVar6 = (char *)realloc(pVVar5->pArray,sVar12);
                        }
                      }
                      pVVar5->pArray = pcVar6;
                      pVVar5->nCap = (int)sVar12;
                    }
LAB_003cfecf:
                    iVar4 = pVVar5->nSize;
                    pVVar5->nSize = iVar4 + 1;
                    pVVar5->pArray[iVar4] = '=';
                    lVar10 = 0;
                    do {
                      cVar1 = " ) ;\n"[lVar10 + 3];
                      uVar2 = pVVar5->nCap;
                      if (pVVar5->nSize == uVar2) {
                        if ((int)uVar2 < 0x10) {
                          if (pVVar5->pArray == (char *)0x0) {
                            pcVar6 = (char *)malloc(0x10);
                          }
                          else {
                            pcVar6 = (char *)realloc(pVVar5->pArray,0x10);
                          }
                          sVar12 = 0x10;
                        }
                        else {
                          sVar12 = (ulong)uVar2 * 2;
                          if ((int)sVar12 <= (int)uVar2) goto LAB_003cff48;
                          if (pVVar5->pArray == (char *)0x0) {
                            pcVar6 = (char *)malloc(sVar12);
                          }
                          else {
                            pcVar6 = (char *)realloc(pVVar5->pArray,sVar12);
                          }
                        }
                        pVVar5->pArray = pcVar6;
                        pVVar5->nCap = (int)sVar12;
                      }
LAB_003cff48:
                      iVar4 = pVVar5->nSize;
                      pVVar5->nSize = iVar4 + 1;
                      pVVar5->pArray[iVar4] = cVar1;
                      lVar10 = lVar10 + 1;
                    } while (lVar10 != 2);
                    uVar2 = pSVar7->Child;
                    while( true ) {
                      if (p->nItems <= (int)uVar2) goto LAB_003d028e;
                      if ((int)uVar2 < 0) {
                        pPin_00 = (Scl_Item_t *)0x0;
                      }
                      else {
                        pPin_00 = p->pItems + uVar2;
                      }
                      if (pPin_00 == (Scl_Item_t *)0x0) break;
                      iVar4 = (pPin_00->Key).Beg;
                      iVar3 = (pPin_00->Key).End - iVar4;
                      iVar4 = strncmp(p->pContents + iVar4,"pin",(long)iVar3);
                      if ((iVar3 == 3 && iVar4 == 0) &&
                         (pcVar6 = Scl_LibertyReadPinFormula(p,pPin_00), pcVar6 != (char *)0x0)) {
                        lVar10 = 0;
                        do {
                          cVar1 = "         PIN "[lVar10 + 7];
                          uVar2 = pVVar5->nCap;
                          if (pVVar5->nSize == uVar2) {
                            if ((int)uVar2 < 0x10) {
                              if (pVVar5->pArray == (char *)0x0) {
                                pcVar6 = (char *)malloc(0x10);
                              }
                              else {
                                pcVar6 = (char *)realloc(pVVar5->pArray,0x10);
                              }
                              sVar12 = 0x10;
                            }
                            else {
                              sVar12 = (ulong)uVar2 * 2;
                              if ((int)sVar12 <= (int)uVar2) goto LAB_003d0053;
                              if (pVVar5->pArray == (char *)0x0) {
                                pcVar6 = (char *)malloc(sVar12);
                              }
                              else {
                                pcVar6 = (char *)realloc(pVVar5->pArray,sVar12);
                              }
                            }
                            pVVar5->pArray = pcVar6;
                            pVVar5->nCap = (int)sVar12;
                          }
LAB_003d0053:
                          iVar4 = pVVar5->nSize;
                          pVVar5->nSize = iVar4 + 1;
                          pVVar5->pArray[iVar4] = cVar1;
                          lVar10 = lVar10 + 1;
                        } while (lVar10 != 6);
                        pcVar6 = Scl_LibertyReadString(p,pPin_00->Head);
                        sVar12 = strlen(pcVar6);
                        if (0 < (int)(uint)sVar12) {
                          uVar11 = 0;
                          do {
                            cVar1 = pcVar6[uVar11];
                            uVar2 = pVVar5->nCap;
                            if (pVVar5->nSize == uVar2) {
                              if ((int)uVar2 < 0x10) {
                                if (pVVar5->pArray == (char *)0x0) {
                                  pcVar9 = (char *)malloc(0x10);
                                }
                                else {
                                  pcVar9 = (char *)realloc(pVVar5->pArray,0x10);
                                }
                                sVar8 = 0x10;
                              }
                              else {
                                sVar8 = (ulong)uVar2 * 2;
                                if ((int)sVar8 <= (int)uVar2) goto LAB_003d010a;
                                if (pVVar5->pArray == (char *)0x0) {
                                  pcVar9 = (char *)malloc(sVar8);
                                }
                                else {
                                  pcVar9 = (char *)realloc(pVVar5->pArray,sVar8);
                                }
                              }
                              pVVar5->pArray = pcVar9;
                              pVVar5->nCap = (int)sVar8;
                            }
LAB_003d010a:
                            iVar4 = pVVar5->nSize;
                            pVVar5->nSize = iVar4 + 1;
                            pVVar5->pArray[iVar4] = cVar1;
                            uVar11 = uVar11 + 1;
                          } while (((uint)sVar12 & 0x7fffffff) != uVar11);
                        }
                        lVar10 = 0;
                        do {
                          cVar1 = "    PIN  %13s  UNKNOWN  1  999  1.00  0.00  1.00  0.00\n"
                                  [lVar10 + 0xe];
                          uVar2 = pVVar5->nCap;
                          if (pVVar5->nSize == uVar2) {
                            if ((int)uVar2 < 0x10) {
                              if (pVVar5->pArray == (char *)0x0) {
                                pcVar6 = (char *)malloc(0x10);
                              }
                              else {
                                pcVar6 = (char *)realloc(pVVar5->pArray,0x10);
                              }
                              sVar12 = 0x10;
                            }
                            else {
                              sVar12 = (ulong)uVar2 * 2;
                              if ((int)sVar12 <= (int)uVar2) goto LAB_003d019c;
                              if (pVVar5->pArray == (char *)0x0) {
                                pcVar6 = (char *)malloc(sVar12);
                              }
                              else {
                                pcVar6 = (char *)realloc(pVVar5->pArray,sVar12);
                              }
                            }
                            pVVar5->pArray = pcVar6;
                            pVVar5->nCap = (int)sVar12;
                          }
LAB_003d019c:
                          iVar4 = pVVar5->nSize;
                          pVVar5->nSize = iVar4 + 1;
                          pVVar5->pArray[iVar4] = cVar1;
                          lVar10 = lVar10 + 1;
                        } while (lVar10 != 0x29);
                      }
                      uVar2 = pPin_00->Next;
                    }
                  }
                  uVar2 = pPin->Next;
                  if (p->nItems <= (int)uVar2) break;
                  if ((int)uVar2 < 0) goto LAB_003cfa2d;
LAB_003cfab7:
                  pPin = p->pItems + uVar2;
                } while( true );
              }
              goto LAB_003d028e;
            }
            if (fVerbose != 0) {
              pcVar6 = Scl_LibertyReadString(p,pSVar7->Head);
              pcVar9 = "Scl_LibertyReadGenlib() skipped cell \"%s\" without logic function.\n";
              goto LAB_003cf9ce;
            }
          }
          else if (fVerbose != 0) {
            pcVar6 = Scl_LibertyReadString(p,pSVar7->Head);
            pcVar9 = "Scl_LibertyReadGenlib() skipped three-state cell \"%s\".\n";
            goto LAB_003cf9ce;
          }
        }
        else if (fVerbose != 0) {
          pcVar6 = Scl_LibertyReadString(p,pSVar7->Head);
          pcVar9 = "Scl_LibertyReadGenlib() skipped sequential cell \"%s\".\n";
LAB_003cf9ce:
          printf(pcVar9,pcVar6);
        }
      }
LAB_003cf9d8:
      uVar2 = pSVar7->Next;
      if (p->nItems <= (int)uVar2) goto LAB_003d028e;
      if ((int)uVar2 < 0) {
        pSVar7 = (Scl_Item_t *)0x0;
      }
      else {
        pSVar7 = p->pItems + uVar2;
      }
    } while (pSVar7 != (Scl_Item_t *)0x0);
  }
  lVar10 = 0;
  do {
    cVar1 = "\n.end\n"[lVar10];
    uVar2 = pVVar5->nCap;
    if (pVVar5->nSize == uVar2) {
      if ((int)uVar2 < 0x10) {
        if (pVVar5->pArray == (char *)0x0) {
          pcVar6 = (char *)malloc(0x10);
        }
        else {
          pcVar6 = (char *)realloc(pVVar5->pArray,0x10);
        }
        sVar12 = 0x10;
      }
      else {
        sVar12 = (ulong)uVar2 * 2;
        if ((int)sVar12 <= (int)uVar2) goto LAB_003cf8df;
        if (pVVar5->pArray == (char *)0x0) {
          pcVar6 = (char *)malloc(sVar12);
        }
        else {
          pcVar6 = (char *)realloc(pVVar5->pArray,sVar12);
        }
      }
      pVVar5->pArray = pcVar6;
      pVVar5->nCap = (int)sVar12;
    }
LAB_003cf8df:
    iVar4 = pVVar5->nSize;
    pVVar5->nSize = iVar4 + 1;
    pVVar5->pArray[iVar4] = cVar1;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 6);
  uVar2 = pVVar5->nCap;
  if (pVVar5->nSize == uVar2) {
    if ((int)uVar2 < 0x10) {
      if (pVVar5->pArray == (char *)0x0) {
        pcVar6 = (char *)malloc(0x10);
      }
      else {
        pcVar6 = (char *)realloc(pVVar5->pArray,0x10);
      }
      sVar12 = 0x10;
    }
    else {
      sVar12 = (ulong)uVar2 * 2;
      if ((int)sVar12 <= (int)uVar2) goto LAB_003d0260;
      if (pVVar5->pArray == (char *)0x0) {
        pcVar6 = (char *)malloc(sVar12);
      }
      else {
        pcVar6 = (char *)realloc(pVVar5->pArray,sVar12);
      }
    }
    pVVar5->pArray = pcVar6;
    pVVar5->nCap = (int)sVar12;
  }
LAB_003d0260:
  iVar4 = pVVar5->nSize;
  pVVar5->nSize = iVar4 + 1;
  pVVar5->pArray[iVar4] = '\0';
  return pVVar5;
}

Assistant:

Vec_Str_t * Scl_LibertyReadGenlibStr( Scl_Tree_t * p, int fVerbose )
{
    Vec_Str_t * vStr;
    Scl_Item_t * pCell, * pOutput, * pInput;
    char * pFormula;
    vStr = Vec_StrAlloc( 1000 );
    Vec_StrPrintStr( vStr, "GATE          _const0_  0.000000  z=CONST0;\n" );
    Vec_StrPrintStr( vStr, "GATE          _const1_  0.000000  z=CONST1;\n" );
    Scl_ItemForEachChildName( p, Scl_LibertyRoot(p), pCell, "cell" )
    {
        if ( Scl_LibertyReadCellIsFlop(p, pCell) )
        {
            if ( fVerbose )  printf( "Scl_LibertyReadGenlib() skipped sequential cell \"%s\".\n", Scl_LibertyReadString(p, pCell->Head) );
            continue;
        }
        if ( Scl_LibertyReadCellIsThreeState(p, pCell) )
        {
            if ( fVerbose )  printf( "Scl_LibertyReadGenlib() skipped three-state cell \"%s\".\n", Scl_LibertyReadString(p, pCell->Head) );
            continue;
        }
        if ( Scl_LibertyReadCellOutputNum(p, pCell) == 0 )
        {
            if ( fVerbose )  printf( "Scl_LibertyReadGenlib() skipped cell \"%s\" without logic function.\n", Scl_LibertyReadString(p, pCell->Head) );
            continue;
        }
        // iterate through output pins
        Scl_ItemForEachChildName( p, pCell, pOutput, "pin" )
        {
            if ( (pFormula = Scl_LibertyReadPinFormula(p, pOutput)) ) 
                continue;
            if ( !strcmp(pFormula, "0") || !strcmp(pFormula, "1") )
            {
                if ( fVerbose ) printf( "Scl_LibertyReadGenlib() skipped cell \"%s\" with constant formula \"%s\".\n", Scl_LibertyReadString(p, pCell->Head), pFormula );
                break;
            }
            Vec_StrPrintStr( vStr, "GATE " );
            Vec_StrPrintStr( vStr, Scl_LibertyReadString(p, pCell->Head) );
            Vec_StrPrintStr( vStr, " " );
            Vec_StrPrintStr( vStr, Scl_LibertyReadCellArea(p, pCell) );
            Vec_StrPrintStr( vStr, " " );
            Vec_StrPrintStr( vStr, Scl_LibertyReadString(p, pOutput->Head) );
            Vec_StrPrintStr( vStr, "=" );
            Vec_StrPrintStr( vStr, pFormula );
            Vec_StrPrintStr( vStr, ";\n" );
            // iterate through input pins
            Scl_ItemForEachChildName( p, pCell, pInput, "pin" )
            {
                if ( Scl_LibertyReadPinFormula(p, pInput) == NULL )
                    continue;
                Vec_StrPrintStr( vStr, "  PIN " );
                Vec_StrPrintStr( vStr, Scl_LibertyReadString(p, pInput->Head) );
                Vec_StrPrintStr( vStr, " UNKNOWN  1  999  1.00  0.00  1.00  0.00\n" );
            }
        }
    }
    Vec_StrPrintStr( vStr, "\n.end\n" );
    Vec_StrPush( vStr, '\0' );
//    printf( "%s", Vec_StrArray(vStr) );
    return vStr;
}